

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void duckdb_parquet::swap(SchemaElement *a,SchemaElement *b)

{
  _SchemaElement__isset _Var1;
  type tVar2;
  int32_t iVar3;
  type tVar4;
  int32_t iVar5;
  type tVar6;
  type tVar7;
  
  iVar3 = b->type_length;
  tVar4 = a->type;
  iVar5 = a->type_length;
  a->type = b->type;
  a->type_length = iVar3;
  b->type = tVar4;
  b->type_length = iVar5;
  tVar2 = a->repetition_type;
  a->repetition_type = b->repetition_type;
  b->repetition_type = tVar2;
  std::__cxx11::string::swap((string *)&a->name);
  tVar6 = b->converted_type;
  iVar3 = a->num_children;
  tVar7 = a->converted_type;
  a->num_children = b->num_children;
  a->converted_type = tVar6;
  b->num_children = iVar3;
  b->converted_type = tVar7;
  iVar3 = a->scale;
  a->scale = b->scale;
  b->scale = iVar3;
  iVar3 = a->precision;
  a->precision = b->precision;
  b->precision = iVar3;
  iVar3 = a->field_id;
  a->field_id = b->field_id;
  b->field_id = iVar3;
  swap(&a->logicalType,&b->logicalType);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(SchemaElement &a, SchemaElement &b) {
  using ::std::swap;
  swap(a.type, b.type);
  swap(a.type_length, b.type_length);
  swap(a.repetition_type, b.repetition_type);
  swap(a.name, b.name);
  swap(a.num_children, b.num_children);
  swap(a.converted_type, b.converted_type);
  swap(a.scale, b.scale);
  swap(a.precision, b.precision);
  swap(a.field_id, b.field_id);
  swap(a.logicalType, b.logicalType);
  swap(a.__isset, b.__isset);
}